

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int luaK_jump(FuncState *fs)

{
  int local_18;
  int local_14;
  int j;
  int jpc;
  FuncState *fs_local;
  
  local_14 = fs->jpc;
  fs->jpc = -1;
  _j = fs;
  local_18 = luaK_codeABx(fs,OP_JMP,0,0x7fff);
  luaK_concat(_j,&local_18,local_14);
  return local_18;
}

Assistant:

int luaK_jump (FuncState *fs) {
  int jpc = fs->jpc;  /* save list of jumps to here */
  int j;
  fs->jpc = NO_JUMP;  /* no more jumps to here */
  j = luaK_codeAsBx(fs, OP_JMP, 0, NO_JUMP);
  luaK_concat(fs, &j, jpc);  /* keep them on hold */
  return j;
}